

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ApplySizeFullWithConstraint(ImGuiWindow *window,ImVec2 new_size)

{
  ImVec2 IVar1;
  ImGuiContext *pIVar2;
  float v;
  float local_60;
  float local_5c;
  undefined1 local_50 [8];
  ImGuiSizeConstraintCallbackData data;
  ImRect cr;
  ImGuiContext *g;
  ImGuiWindow *window_local;
  ImVec2 new_size_local;
  
  pIVar2 = GImGui;
  window_local = (ImGuiWindow *)new_size;
  if ((GImGui->SetNextWindowSizeConstraint & 1U) != 0) {
    data.DesiredSize = (GImGui->SetNextWindowSizeConstraintRect).Min;
    IVar1 = (GImGui->SetNextWindowSizeConstraintRect).Max;
    if ((data.DesiredSize.x < 0.0) || (cr.Min.x = IVar1.x, cr.Min.x < 0.0)) {
      local_5c = (window->SizeFull).x;
    }
    else {
      window_local._0_4_ = new_size.x;
      v = window_local._0_4_;
      local_5c = ImClamp(v,data.DesiredSize.x,cr.Min.x);
    }
    window_local = (ImGuiWindow *)CONCAT44(window_local._4_4_,local_5c);
    if ((data.DesiredSize.y < 0.0) || (cr.Min.y = IVar1.y, cr.Min.y < 0.0)) {
      local_60 = (window->SizeFull).y;
    }
    else {
      local_60 = ImClamp(window_local._4_4_,data.DesiredSize.y,cr.Min.y);
    }
    window_local = (ImGuiWindow *)CONCAT44(local_60,window_local._0_4_);
    if (pIVar2->SetNextWindowSizeConstraintCallback != (ImGuiSizeConstraintCallback)0x0) {
      ImGuiSizeConstraintCallbackData::ImGuiSizeConstraintCallbackData
                ((ImGuiSizeConstraintCallbackData *)local_50);
      local_50 = (undefined1  [8])pIVar2->SetNextWindowSizeConstraintCallbackUserData;
      data.UserData = *(void **)&window->Pos;
      data.Pos = window->SizeFull;
      data.CurrentSize = (ImVec2)window_local;
      (*pIVar2->SetNextWindowSizeConstraintCallback)((ImGuiSizeConstraintCallbackData *)local_50);
      window_local = (ImGuiWindow *)data.CurrentSize;
    }
  }
  if ((window->Flags & 0x100040U) == 0) {
    window_local = (ImGuiWindow *)ImMax((ImVec2 *)&window_local,&(pIVar2->Style).WindowMinSize);
  }
  window->SizeFull = (ImVec2)window_local;
  return;
}

Assistant:

static void ApplySizeFullWithConstraint(ImGuiWindow* window, ImVec2 new_size)
{
    ImGuiContext& g = *GImGui;
    if (g.SetNextWindowSizeConstraint)
    {
        // Using -1,-1 on either X/Y axis to preserve the current size.
        ImRect cr = g.SetNextWindowSizeConstraintRect;
        new_size.x = (cr.Min.x >= 0 && cr.Max.x >= 0) ? ImClamp(new_size.x, cr.Min.x, cr.Max.x) : window->SizeFull.x;
        new_size.y = (cr.Min.y >= 0 && cr.Max.y >= 0) ? ImClamp(new_size.y, cr.Min.y, cr.Max.y) : window->SizeFull.y;
        if (g.SetNextWindowSizeConstraintCallback)
        {
            ImGuiSizeConstraintCallbackData data;
            data.UserData = g.SetNextWindowSizeConstraintCallbackUserData;
            data.Pos = window->Pos;
            data.CurrentSize = window->SizeFull;
            data.DesiredSize = new_size;
            g.SetNextWindowSizeConstraintCallback(&data);
            new_size = data.DesiredSize;
        }
    }
    if (!(window->Flags & (ImGuiWindowFlags_ChildWindow | ImGuiWindowFlags_AlwaysAutoResize)))
        new_size = ImMax(new_size, g.Style.WindowMinSize);
    window->SizeFull = new_size;
}